

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFormatTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles2::Functional::Texture2DFormatCase::iterate(Texture2DFormatCase *this)

{
  ostringstream *this_00;
  int preferredHeight;
  RenderContext *context;
  bool bVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  undefined4 extraout_var_02;
  uint uVar7;
  char *description;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  Surface renderedFrame;
  Surface referenceFrame;
  TextureFormatInfo spec;
  RandomViewport local_318;
  vector<float,_std::allocator<float>_> local_308;
  TextureFormat local_2f0;
  Surface local_2e8;
  undefined1 *local_2d0;
  ConstPixelBufferAccess *local_2c8;
  ulong local_2c0;
  Surface local_2b8;
  TextureParameterValueStr local_2a0;
  TextureParameterValueStr local_298;
  TextureParameterValueStr local_290;
  ReferenceParams local_284;
  TextureFormatInfo local_1f0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar5;
  undefined4 extraout_var_01;
  
  local_2f0 = (TextureFormat)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = this->m_width;
  preferredHeight = this->m_height;
  dVar4 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_318,(RenderTarget *)CONCAT44(extraout_var_00,iVar3),iVar2,preferredHeight,dVar4)
  ;
  tcu::Surface::Surface(&local_2e8,local_318.width,local_318.height);
  tcu::Surface::Surface(&local_2b8,local_318.width,local_318.height);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  lVar6 = CONCAT44(extraout_var_01,iVar2);
  uVar9 = 0x1000000 << (8U - (char)*(int *)(lVar6 + 0x14) & 0x1f);
  bVar8 = 8 - *(char *)(lVar6 + 8);
  if (*(int *)(lVar6 + 0x14) < 1) {
    uVar9 = 0;
  }
  uVar11 = 0x100 << (8U - *(char *)(lVar6 + 0xc) & 0x1f) | 1 << (bVar8 & 0x1f);
  uVar9 = 0x10000 << (8U - *(char *)(lVar6 + 0x10) & 0x1f) | uVar11 | uVar9;
  uVar10 = 1 << (bVar8 & 0x1f) & 0xff;
  if (0xfd < uVar10) {
    uVar10 = 0xfe;
  }
  uVar11 = uVar11 >> 8 & 0xff;
  if (0xfd < uVar11) {
    uVar11 = 0xfe;
  }
  uVar7 = uVar9 >> 0x10 & 0xff;
  if (0xfd < uVar7) {
    uVar7 = 0xfe;
  }
  local_2c0 = (ulong)uVar7;
  uVar9 = uVar9 >> 0x18;
  if (0xfd < uVar9) {
    uVar9 = 0xfe;
  }
  local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_284,TEXTURETYPE_2D);
  tcu::getTextureFormatInfo(&local_1f0,(TextureFormat *)&this->m_texture->m_refTexture);
  local_284.super_RenderParams.flags._0_1_ = (byte)local_284.super_RenderParams.flags | 0xc;
  local_284.super_RenderParams.samplerType =
       glu::TextureTestUtil::getSamplerType
                 ((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_format);
  local_284.sampler.wrapS = CLAMP_TO_EDGE;
  local_284.sampler.wrapT = CLAMP_TO_EDGE;
  local_284.sampler.wrapR = CLAMP_TO_EDGE;
  local_284.sampler.minFilter = NEAREST;
  local_284.sampler.magFilter = NEAREST;
  local_284.sampler.lodThreshold = 0.0;
  local_284.sampler.normalizedCoords = true;
  local_284.sampler.compare = COMPAREMODE_NONE;
  local_284.sampler.compareChannel = 0;
  local_284.sampler.borderColor.v._0_8_ = 0;
  local_284.sampler.borderColor.v._8_8_ = 0;
  local_284.sampler.seamlessCubeMap = false;
  local_284.sampler._53_3_ = 0;
  local_284.sampler.depthStencilMode = MODE_DEPTH;
  local_284.super_RenderParams.colorScale.m_data[0] = local_1f0.lookupScale.m_data[0];
  local_284.super_RenderParams.colorScale.m_data[1] = local_1f0.lookupScale.m_data[1];
  local_284.super_RenderParams.colorScale.m_data[2] = local_1f0.lookupScale.m_data[2];
  local_284.super_RenderParams.colorScale.m_data[3] = local_1f0.lookupScale.m_data[3];
  local_284.super_RenderParams.colorBias.m_data[0] = local_1f0.lookupBias.m_data[0];
  local_284.super_RenderParams.colorBias.m_data[1] = local_1f0.lookupBias.m_data[1];
  local_284.super_RenderParams.colorBias.m_data[2] = local_1f0.lookupBias.m_data[2];
  local_284.super_RenderParams.colorBias.m_data[3] = local_1f0.lookupBias.m_data[3];
  local_1b0._0_4_ = R;
  local_1b0._4_4_ = SNORM_INT8;
  local_2d0 = &DAT_3f8000003f800000;
  glu::TextureTestUtil::computeQuadTexCoord2D(&local_308,(Vec2 *)local_1b0,(Vec2 *)&local_2d0);
  this_00 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_4_ = local_2f0.order;
  local_1b0._4_4_ = local_2f0.type;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Texture parameters:",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n  WRAP_S = ",0xc);
  local_2d0 = (undefined1 *)0x812f00002802;
  glu::detail::operator<<((ostream *)this_00,(TextureParameterValueStr *)&local_2d0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n  WRAP_T = ",0xc);
  local_290.param = 0x2803;
  local_290.value = 0x812f;
  glu::detail::operator<<((ostream *)this_00,&local_290);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n  MIN_FILTER = ",0x10);
  local_298.param = 0x2801;
  local_298.value = 0x2600;
  glu::detail::operator<<((ostream *)this_00,&local_298);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n  MAG_FILTER = ",0x10);
  local_2a0.param = 0x2800;
  local_2a0.value = 0x2600;
  glu::detail::operator<<((ostream *)this_00,&local_2a0);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  (**(code **)(lVar5 + 0x1a00))(local_318.x,local_318.y,local_318.width,local_318.height);
  (*this->m_texture->_vptr_Texture2D[2])();
  (**(code **)(lVar5 + 8))(0x84c0);
  (**(code **)(lVar5 + 0xb8))(0xde1,this->m_texture->m_glTexture);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2803,0x812f);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2801,0x2600);
  (**(code **)(lVar5 + 0x1360))(0xde1,0x2800,0x2600);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureFormatTests.cpp"
                  ,0xb9);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,
             local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_284.super_RenderParams);
  context = this->m_renderCtx;
  local_2d0 = (undefined1 *)0x300000008;
  if ((void *)local_2e8.m_pixels.m_cap != (void *)0x0) {
    local_2e8.m_pixels.m_cap = (size_t)local_2e8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2d0,local_2e8.m_width,
             local_2e8.m_height,1,(void *)local_2e8.m_pixels.m_cap);
  glu::readPixels(context,local_318.x,local_318.y,(PixelBufferAccess *)local_1b0);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureFormatTests.cpp"
                  ,0xbe);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            ((SurfaceAccess *)local_1b0,&local_2b8,
             (PixelFormat *)(CONCAT44(extraout_var_02,iVar2) + 8));
  local_2c8 = (this->m_texture->m_refTexture).m_view.m_levels;
  local_2d0 = (undefined1 *)
              CONCAT44(local_2d0._4_4_,(this->m_texture->m_refTexture).m_view.m_numLevels);
  glu::TextureTestUtil::sampleTexture
            ((SurfaceAccess *)local_1b0,(Texture2DView *)&local_2d0,
             local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_284);
  bVar1 = glu::TextureTestUtil::compareImages
                    ((TestLog *)local_2f0,&local_2b8,&local_2e8,
                     (RGBA)(uVar9 * 0x1000000 + ((int)local_2c0 << 0x10 | uVar11 * 0x100 + uVar10) +
                           0x1010101));
  description = "Image comparison failed";
  if (bVar1) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,(uint)!bVar1,description);
  if (local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_2b8);
  tcu::Surface::~Surface(&local_2e8);
  return STOP;
}

Assistant:

Texture2DFormatCase::IterateResult Texture2DFormatCase::iterate (void)
{
	TestLog&				log					= m_testCtx.getLog();
	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	RandomViewport			viewport			(m_renderCtx.getRenderTarget(), m_width, m_height, deStringHash(getName()));
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);
	tcu::Surface			referenceFrame		(viewport.width, viewport.height);
	tcu::RGBA				threshold			= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<float>			texCoord;
	ReferenceParams			renderParams		(TEXTURETYPE_2D);
	tcu::TextureFormatInfo	spec				= tcu::getTextureFormatInfo(m_texture->getRefTexture().getFormat());
	const deUint32			wrapS				= GL_CLAMP_TO_EDGE;
	const deUint32			wrapT				= GL_CLAMP_TO_EDGE;
	const deUint32			minFilter			= GL_NEAREST;
	const deUint32			magFilter			= GL_NEAREST;

	renderParams.flags			|= RenderParams::LOG_ALL;
	renderParams.samplerType	= getSamplerType(m_texture->getRefTexture().getFormat());
	renderParams.sampler		= Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
	renderParams.colorScale		= spec.lookupScale;
	renderParams.colorBias		= spec.lookupBias;

	computeQuadTexCoord2D(texCoord, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f));

	log << TestLog::Message << "Texture parameters:"
							<< "\n  WRAP_S = " << getTextureParameterValueStr(GL_TEXTURE_WRAP_S, wrapS)
							<< "\n  WRAP_T = " << getTextureParameterValueStr(GL_TEXTURE_WRAP_T, wrapT)
							<< "\n  MIN_FILTER = " << getTextureParameterValueStr(GL_TEXTURE_MIN_FILTER, minFilter)
							<< "\n  MAG_FILTER = " << getTextureParameterValueStr(GL_TEXTURE_MAG_FILTER, magFilter)
		<< TestLog::EndMessage;

	// Setup base viewport.
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Upload texture data to GL.
	m_texture->upload();

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D, m_texture->getGLTexture());

	// Setup nearest neighbor filtering and clamp-to-edge.
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, wrapT);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, magFilter);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	// Draw.
	m_renderer.renderQuad(0, &texCoord[0], renderParams);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels()");

	// Compute reference.
	sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), m_texture->getRefTexture(), &texCoord[0], renderParams);

	// Compare and log.
	bool isOk = compareImages(log, referenceFrame, renderedFrame, threshold);

	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Image comparison failed");

	return STOP;
}